

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O0

void trial::protocol::core::detail::test_close_impl<double>
               (char *expr1,char *expr2,char *file,int line,char *function,double *lhs,double *rhs,
               double tolerance)

{
  ostream *poVar1;
  double tolerance_local;
  double *lhs_local;
  char *function_local;
  int line_local;
  char *file_local;
  char *expr2_local;
  char *expr1_local;
  
  if (tolerance < ABS(*lhs - *rhs)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,file);
    poVar1 = std::operator<<(poVar1,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
    poVar1 = std::operator<<(poVar1,"): test \'");
    poVar1 = std::operator<<(poVar1,expr1);
    poVar1 = std::operator<<(poVar1," == ");
    poVar1 = std::operator<<(poVar1,expr2);
    poVar1 = std::operator<<(poVar1,"\' failed in function \'");
    poVar1 = std::operator<<(poVar1,function);
    poVar1 = std::operator<<(poVar1,"\': ");
    poVar1 = std::operator<<(poVar1,"\'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*lhs);
    poVar1 = std::operator<<(poVar1,"\' != \'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*rhs);
    poVar1 = std::operator<<(poVar1,"\'");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    test_failure();
  }
  else {
    test_success();
  }
  return;
}

Assistant:

inline void test_close_impl(char const * expr1,
                            char const * expr2,
                            char const * file, int line, char const * function,
                            const T& lhs, const T& rhs, T tolerance)
{
    if (std::fabs(lhs - rhs) <= tolerance)
    {
        test_success();
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
            << file << "(" << line << "): test '" << expr1 << " == " << expr2
            << "' failed in function '" << function << "': "
            << "'" << lhs << "' != '" << rhs << "'" << std::endl;
        test_failure();
    }
}